

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

void __thiscall LongReadsMapper::update_indexes(LongReadsMapper *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  value_type *pvVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar8;
  undefined4 extraout_var_01;
  long *in_RDI;
  value_type *m;
  int64_t i;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_ffffffffffffff68;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  in_stack_ffffffffffffff78;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar9;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  value_type *pvVar10;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  long *__new_size;
  vector<long,_std::allocator<long>_> *this_00;
  value_type *local_38;
  
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin(in_stack_ffffffffffffff68);
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end(in_stack_ffffffffffffff68);
  bVar1 = std::
          is_sorted<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = sdglib::OutputLog((LogLevels)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                               SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
    poVar3 = std::operator<<(poVar3,"Sorting mappings");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin(in_stack_ffffffffffffff68)
    ;
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end(in_stack_ffffffffffffff68);
    sdglib::
    sort<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x3f46c0);
  __new_size = in_RDI + 0x16;
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::vector<long,_std::allocator<long>_>::clear((vector<long,_std::allocator<long>_> *)0x3f46fb);
  this_00 = (vector<long,_std::allocator<long>_> *)(in_RDI + 9);
  LongReadsDatastore::size((LongReadsDatastore *)0x3f4715);
  std::vector<long,_std::allocator<long>_>::resize
            (this_00,(size_type)__new_size,(value_type *)in_stack_ffffffffffffff90);
  local_38 = (value_type *)0x0;
  do {
    pvVar10 = local_38;
    pvVar4 = (value_type *)
             std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::size
                       ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)(in_RDI + 6));
    if (pvVar4 <= pvVar10) {
      return;
    }
    pvVar5 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator[]
                       ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)(in_RDI + 6),
                        (size_type)local_38);
    sVar6 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)(in_RDI + 9));
    if (sVar6 <= pvVar5->read_id) {
      std::vector<long,_std::allocator<long>_>::resize(this_00,(size_type)__new_size,pvVar10);
    }
    pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)(in_RDI + 9),(ulong)pvVar5->read_id);
    if (*pvVar7 == -1) {
      pvVar10 = local_38;
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 9),(ulong)pvVar5->read_id
                         );
      *pvVar7 = (value_type)pvVar10;
    }
    pvVar9 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)(in_RDI + 0x16);
    iVar2 = std::abs((int)pvVar5->node);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](pvVar9,CONCAT44(extraout_var,iVar2));
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pvVar9);
    if (bVar1) {
LAB_003f4884:
      in_stack_ffffffffffffff70 =
           (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)(in_RDI + 0x16);
      iVar2 = std::abs((int)pvVar5->node);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[](in_stack_ffffffffffffff70,CONCAT44(extraout_var_01,iVar2));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff70,
                 (value_type_conflict1 *)in_stack_ffffffffffffff68);
    }
    else {
      pvVar9 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x16);
      iVar2 = std::abs((int)pvVar5->node);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[](pvVar9,CONCAT44(extraout_var_00,iVar2));
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_ffffffffffffff70);
      if (*pvVar8 != (ulong)pvVar5->read_id) goto LAB_003f4884;
    }
    local_38 = (value_type *)((long)local_38 + 1);
  } while( true );
}

Assistant:

void LongReadsMapper::update_indexes() {
    if (!std::is_sorted(mappings.begin(), mappings.end())) {
        sdglib::OutputLog() << "Sorting mappings" << std::endl;
        sdglib::sort(mappings.begin(), mappings.end());
    }
    reads_in_node.clear();
    reads_in_node.resize(sg.nodes.size());
    first_mapping.clear();
    first_mapping.resize(datastore.size()+1,-1);
    for (int64_t i=0;i<mappings.size();++i){
        auto &m=mappings[i];
        if (first_mapping.size()<=m.read_id) first_mapping.resize(m.read_id+1,-1);
        if (first_mapping[m.read_id]==-1) first_mapping[m.read_id]=i;
        if (reads_in_node[std::abs(m.node)].empty() or reads_in_node[std::abs(m.node)].back()!=m.read_id)
            reads_in_node[std::abs(m.node)].push_back(m.read_id);
    }
}